

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::IntegerFunctionCase::IntegerFunctionCase
          (IntegerFunctionCase *this,TestContext *testCtx,char *name,char *description,
          ShaderType shaderType)

{
  char *__s;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  ShaderType local_2c;
  char *pcStack_28;
  ShaderType shaderType_local;
  char *description_local;
  char *name_local;
  TestContext *testCtx_local;
  IntegerFunctionCase *this_local;
  
  local_2c = shaderType;
  pcStack_28 = description;
  description_local = name;
  name_local = (char *)testCtx;
  testCtx_local = (TestContext *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_51);
  __s = pcStack_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_89);
  TestCase::TestCase(&this->super_TestCase,testCtx,&local_50,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__IntegerFunctionCase_016b6628;
  this->m_shaderType = local_2c;
  ShaderSpec::ShaderSpec(&this->m_spec);
  this->m_numValues = 100;
  return;
}

Assistant:

IntegerFunctionCase::IntegerFunctionCase (tcu::TestContext& testCtx, const char* name, const char* description, glu::ShaderType shaderType)
	: TestCase		(testCtx, name, description)
	, m_shaderType	(shaderType)
	, m_numValues	(100)
{
}